

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

bool __thiscall
brotli::BrotliCompressor::WriteMetadata
          (BrotliCompressor *this,size_t input_size,uint8_t *input_buffer,bool is_last,
          size_t *encoded_size,uint8_t *encoded_buffer)

{
  size_t sVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong __n;
  int local_84;
  size_t hdr_size;
  uint32_t nbytes;
  uint32_t nbits;
  size_t storage_ix;
  uint8_t *hdr_buffer;
  uint64_t hdr_buffer_data [2];
  uint8_t *encoded_buffer_local;
  size_t *encoded_size_local;
  bool is_last_local;
  uint8_t *input_buffer_local;
  size_t input_size_local;
  BrotliCompressor *this_local;
  
  if ((input_size < 0x1000001) && (input_size + 6 <= *encoded_size)) {
    storage_ix = (size_t)&hdr_buffer;
    _nbytes = (ulong)this->last_byte_bits_;
    hdr_buffer._0_1_ = this->last_byte_;
    WriteBits(1,0,(size_t *)&nbytes,(uint8_t *)storage_ix);
    WriteBits(2,3,(size_t *)&nbytes,(uint8_t *)storage_ix);
    WriteBits(1,0,(size_t *)&nbytes,(uint8_t *)storage_ix);
    if (input_size == 0) {
      WriteBits(2,0,(size_t *)&nbytes,(uint8_t *)storage_ix);
      *encoded_size = _nbytes + 7 >> 3;
      memcpy(encoded_buffer,(void *)storage_ix,*encoded_size);
    }
    else {
      if (input_size == 1) {
        local_84 = 0;
      }
      else {
        uVar2 = Log2FloorNonZero((ulong)((int)input_size - 1));
        local_84 = uVar2 + 1;
      }
      uVar3 = local_84 + 7U >> 3;
      WriteBits(2,(ulong)uVar3,(size_t *)&nbytes,(uint8_t *)storage_ix);
      WriteBits((ulong)(uVar3 << 3),input_size - 1,(size_t *)&nbytes,(uint8_t *)storage_ix);
      __n = _nbytes + 7 >> 3;
      memcpy(encoded_buffer,(void *)storage_ix,__n);
      memcpy(encoded_buffer + __n,input_buffer,input_size);
      *encoded_size = __n + input_size;
    }
    if (is_last) {
      sVar1 = *encoded_size;
      *encoded_size = sVar1 + 1;
      encoded_buffer[sVar1] = '\x03';
    }
    this->last_byte_ = '\0';
    this->last_byte_bits_ = '\0';
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BrotliCompressor::WriteMetadata(const size_t input_size,
                                     const uint8_t* input_buffer,
                                     const bool is_last,
                                     size_t* encoded_size,
                                     uint8_t* encoded_buffer) {
  if (input_size > (1 << 24) || input_size + 6 > *encoded_size) {
    return false;
  }
  uint64_t hdr_buffer_data[2];
  uint8_t* hdr_buffer = reinterpret_cast<uint8_t*>(&hdr_buffer_data[0]);
  size_t storage_ix = last_byte_bits_;
  hdr_buffer[0] = last_byte_;
  WriteBits(1, 0, &storage_ix, hdr_buffer);
  WriteBits(2, 3, &storage_ix, hdr_buffer);
  WriteBits(1, 0, &storage_ix, hdr_buffer);
  if (input_size == 0) {
    WriteBits(2, 0, &storage_ix, hdr_buffer);
    *encoded_size = (storage_ix + 7u) >> 3;
    memcpy(encoded_buffer, hdr_buffer, *encoded_size);
  } else {
    uint32_t nbits = (input_size == 1) ? 0 : (Log2FloorNonZero(
        static_cast<uint32_t>(input_size) - 1) + 1);
    uint32_t nbytes = (nbits + 7) / 8;
    WriteBits(2, nbytes, &storage_ix, hdr_buffer);
    WriteBits(8 * nbytes, input_size - 1, &storage_ix, hdr_buffer);
    size_t hdr_size = (storage_ix + 7u) >> 3;
    memcpy(encoded_buffer, hdr_buffer, hdr_size);
    memcpy(&encoded_buffer[hdr_size], input_buffer, input_size);
    *encoded_size = hdr_size + input_size;
  }
  if (is_last) {
    encoded_buffer[(*encoded_size)++] = 3;
  }
  last_byte_ = 0;
  last_byte_bits_ = 0;
  return true;
}